

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *message)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  undefined4 uVar1;
  Descriptor *descriptor;
  bool bVar2;
  int iVar3;
  int iVar4;
  ExtensionRangeOptions_VerificationState EVar5;
  MessageOptions *this_00;
  ExtensionRange *pEVar6;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *pRVar7;
  DescriptorProto_ExtensionRange *pDVar8;
  string_view sVar9;
  anon_class_1_0_00000001 local_c1;
  VoidPtr local_c0;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_b8;
  string_view local_b0;
  ExtensionRangeOptions *local_a0;
  ExtensionRangeOptions *range_options;
  VoidPtr local_90;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_88;
  string_view local_80;
  ExtensionRange *local_70;
  ExtensionRange *range;
  int i_1;
  undefined1 local_58 [8];
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  declaration_full_name_set;
  size_t sStack_30;
  int i;
  size_t num_declarations;
  int64_t max_extension_range;
  Descriptor *message_local;
  DescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  max_extension_range = (int64_t)message;
  message_local = (Descriptor *)proto;
  proto_local = (DescriptorProto *)this;
  this_00 = Descriptor::options(message);
  bVar2 = MessageOptions::message_set_wire_format(this_00);
  iVar3 = std::numeric_limits<int>::max();
  iVar4 = 0x1fffffff;
  if (bVar2) {
    iVar4 = iVar3;
  }
  num_declarations = (size_t)iVar4;
  sStack_30 = 0;
  for (declaration_full_name_set.
       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       .settings_.
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
       .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
       heap_or_soo_._12_4_ = 0;
      uVar1 = declaration_full_name_set.
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_._12_4_,
      iVar4 = Descriptor::extension_range_count((Descriptor *)max_extension_range),
      (int)uVar1 < iVar4;
      declaration_full_name_set.
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      heap_or_soo_._12_4_ =
           declaration_full_name_set.
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_._12_4_ + 1) {
    pEVar6 = Descriptor::extension_range
                       ((Descriptor *)max_extension_range,
                        declaration_full_name_set.
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_._12_4_);
    if (pEVar6->options_ != (ExtensionRangeOptions *)0x0) {
      pEVar6 = Descriptor::extension_range
                         ((Descriptor *)max_extension_range,
                          declaration_full_name_set.
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          .settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_._12_4_);
      iVar4 = ExtensionRangeOptions::declaration_size(pEVar6->options_);
      sStack_30 = (long)iVar4 + sStack_30;
    }
  }
  absl::lts_20250127::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_58);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_58,sStack_30);
  range._0_4_ = 0;
  do {
    iVar4 = (int)range;
    iVar3 = Descriptor::extension_range_count((Descriptor *)max_extension_range);
    if (iVar3 <= iVar4) {
LAB_00174a45:
      absl::lts_20250127::
      flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)local_58);
      return;
    }
    local_70 = Descriptor::extension_range((Descriptor *)max_extension_range,(int)range);
    iVar4 = Descriptor::ExtensionRange::end_number(local_70);
    if ((long)(num_declarations + 1) < (long)iVar4) {
      sVar9 = Descriptor::full_name((Descriptor *)max_extension_range);
      descriptor = message_local;
      range_options = (ExtensionRangeOptions *)&num_declarations;
      local_80 = sVar9;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_90,
                 (anon_class_8_1_ab6c19c2 *)&range_options);
      make_error.invoker_ = p_Stack_88;
      make_error.ptr_.obj = local_90.obj;
      AddError(this,local_80,(Message *)descriptor,NUMBER,make_error);
    }
    local_a0 = local_70->options_;
    pRVar7 = ExtensionRangeOptions::declaration(local_a0);
    bVar2 = RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::empty(pRVar7);
    if (!bVar2) {
      bVar2 = ExtensionRangeOptions::has_verification(local_a0);
      if (bVar2) {
        EVar5 = ExtensionRangeOptions::verification(local_a0);
        if (EVar5 == ExtensionRangeOptions_VerificationState_UNVERIFIED) {
          local_b0 = Descriptor::full_name((Descriptor *)max_extension_range);
          pDVar8 = DescriptorProto::extension_range((DescriptorProto *)message_local,(int)range);
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__1,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_c0,&local_c1);
          make_error_00.invoker_ = p_Stack_b8;
          make_error_00.ptr_.obj = local_c0.obj;
          AddError(this,local_b0,&pDVar8->super_Message,EXTENDEE,make_error_00);
          goto LAB_00174a45;
        }
      }
      sVar9 = Descriptor::full_name((Descriptor *)max_extension_range);
      pRVar7 = ExtensionRangeOptions::declaration(local_a0);
      pDVar8 = DescriptorProto::extension_range((DescriptorProto *)message_local,(int)range);
      ValidateExtensionDeclaration
                (this,sVar9,pRVar7,pDVar8,
                 (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_58);
    }
    range._0_4_ = (int)range + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::ValidateExtensionRangeOptions(
    const DescriptorProto& proto, const Descriptor& message) {
  const int64_t max_extension_range =
      static_cast<int64_t>(message.options().message_set_wire_format()
                               ? std::numeric_limits<int32_t>::max()
                               : FieldDescriptor::kMaxNumber);

  size_t num_declarations = 0;
  for (int i = 0; i < message.extension_range_count(); i++) {
    if (message.extension_range(i)->options_ == nullptr) continue;
    num_declarations +=
        message.extension_range(i)->options_->declaration_size();
  }

  // Contains the full names from both "declaration" and "metadata".
  absl::flat_hash_set<absl::string_view> declaration_full_name_set;
  declaration_full_name_set.reserve(num_declarations);

  for (int i = 0; i < message.extension_range_count(); i++) {
    const auto& range = *message.extension_range(i);
    if (range.end_number() > max_extension_range + 1) {
      AddError(message.full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Extension numbers cannot be greater than $0.",
                     max_extension_range);
               });
    }
    const auto& range_options = *range.options_;


    if (!range_options.declaration().empty()) {
      // TODO: remove the "has_verification" check once the default
      // is flipped to DECLARATION.
      if (range_options.has_verification() &&
          range_options.verification() == ExtensionRangeOptions::UNVERIFIED) {
        AddError(message.full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                   return "Cannot mark the extension range as UNVERIFIED when "
                          "it has extension(s) declared.";
                 });
        return;
      }
      ValidateExtensionDeclaration(
          message.full_name(), range_options.declaration(),
          proto.extension_range(i), declaration_full_name_set);
    }
  }
}